

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.hh
# Opt level: O1

expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::Xformable::GetLocalMatrix_abi_cxx11_
          (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Xformable *this,double t,TimeSampleInterpolationType tinterp,
          bool *resetTransformStack)

{
  double *pdVar1;
  bool bVar2;
  long lVar3;
  matrix4d *pmVar4;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *peVar5;
  matrix4d *pmVar6;
  byte bVar7;
  string err;
  matrix4d m;
  string local_f0;
  double *local_d0;
  double local_c8;
  double local_c0;
  double dStack_b8;
  matrix4d local_b0;
  
  bVar7 = 0;
  if ((NAN(t)) && (this->_dirty == false)) goto LAB_002ae5a2;
  local_b0.m[0][0] = 1.0;
  local_b0.m[0][1] = 0.0;
  local_b0.m[0][2] = 0.0;
  local_b0.m[0][3] = 0.0;
  local_b0.m[1][0] = 0.0;
  local_b0.m[1][1] = 1.0;
  local_b0.m[1][2] = 0.0;
  local_b0.m[1][3] = 0.0;
  local_b0.m[2][0] = 0.0;
  local_b0.m[2][1] = 0.0;
  local_b0.m[2][2] = 1.0;
  local_b0.m[2][3] = 0.0;
  local_b0.m[3][0] = 0.0;
  local_b0.m[3][1] = 0.0;
  local_b0.m[3][2] = 0.0;
  local_b0.m[3][3] = 1.0;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  bVar2 = EvaluateXformOps(this,t,tinterp,&local_b0,resetTransformStack,&local_f0);
  if (bVar2) {
    if (!NAN(t)) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      pmVar4 = &local_b0;
      peVar5 = __return_storage_ptr__;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        (peVar5->contained).
        super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.m[0][0] = pmVar4->m[0][0];
        pmVar4 = (matrix4d *)((long)pmVar4 + ((ulong)bVar7 * -2 + 1) * 8);
        peVar5 = (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)peVar5 + (ulong)bVar7 * -0x10 + 8);
      }
      goto LAB_002ae584;
    }
    pmVar4 = &local_b0;
    pmVar6 = &this->_matrix;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pmVar6->m[0][0] = pmVar4->m[0][0];
      pmVar4 = (matrix4d *)((long)pmVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      pmVar6 = (matrix4d *)((long)pmVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    this->_dirty = false;
    bVar2 = true;
  }
  else {
    local_d0 = &local_c0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    pdVar1 = (__return_storage_ptr__->contained).
             super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0.m_value.m[0] + 2;
    *(double **)
     &(__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0 = pdVar1;
    if (local_d0 == &local_c0) {
      *pdVar1 = local_c0;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[0][3] = dStack_b8;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[0][0] = (double)local_d0;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[0][2] = local_c0;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.m[0][1] = local_c8;
LAB_002ae584:
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  if (!bVar2) {
    return __return_storage_ptr__;
  }
LAB_002ae5a2:
  (__return_storage_ptr__->contained).
  super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  pmVar4 = &this->_matrix;
  peVar5 = __return_storage_ptr__;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (peVar5->contained).
    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.m[0][0] = pmVar4->m[0][0];
    pmVar4 = (matrix4d *)((long)pmVar4 + (ulong)bVar7 * -0x10 + 8);
    peVar5 = (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)peVar5 + (ulong)bVar7 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<value::matrix4d, std::string> GetLocalMatrix(double t = value::TimeCode::Default(), value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Linear, bool *resetTransformStack = nullptr) const {
    if (_dirty || !value::TimeCode(t).is_default()) {
      value::matrix4d m;
      std::string err;
      if (EvaluateXformOps(t, tinterp, &m, resetTransformStack, &err)) {
        if (value::TimeCode(t).is_default()) {
          _matrix = m;
          _dirty = false;
        }
        else {
          return m;
        }
      } else {
        return nonstd::make_unexpected(err);
      }
    }

    return _matrix;
  }